

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *bitlen;
  uint *puVar9;
  long lVar10;
  byte bVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint *puVar15;
  bool bVar16;
  size_t local_138;
  char local_129;
  uint *local_128;
  uint *local_120;
  uchar *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  uint local_f4;
  ulong local_f0;
  uint local_e4;
  ucvector v;
  HuffmanTree tree_ll;
  HuffmanTree local_78;
  HuffmanTree local_58;
  
  v.data = *out;
  v.size = *outsize;
  local_138 = 0;
  local_110 = insize * 8;
  uVar13 = 0;
  local_129 = '\0';
  local_118 = in;
  v.allocsize = v.size;
  do {
    puVar2 = local_118;
    if (local_129 != '\0') {
      uVar5 = 0;
      break;
    }
    uVar8 = local_138 + 2;
    if (local_110 <= uVar8) {
LAB_001ab2dd:
      uVar5 = 0x34;
      break;
    }
    local_129 = (local_118[local_138 >> 3] >> ((uint)local_138 & 7) & 1) != 0;
    uVar14 = local_138 + 3;
    bVar11 = (local_118[uVar8 >> 3] >> ((byte)uVar8 & 7)) * '\x02' & 2 |
             (local_118[local_138 + 1 >> 3] >> ((uint)(local_138 + 1) & 7) & 1) != 0;
    if (bVar11 == 0) {
      uVar8 = uVar14 + (5 - (uint)local_138 & 7) >> 3;
      if (insize <= uVar8 + 4) goto LAB_001ab2dd;
      uVar5 = (uint)*(ushort *)(local_118 + uVar8);
      if (*(ushort *)(local_118 + uVar8 + 2) + uVar5 != 0xffff) {
        uVar5 = 0x15;
        break;
      }
      local_138 = uVar14;
      uVar4 = ucvector_resize(&v,uVar5 + uVar13);
      if (uVar4 == 0) {
        uVar5 = 0x53;
        break;
      }
      if (insize < uVar8 + 4 + (ulong)uVar5) {
        uVar5 = 0x17;
        break;
      }
      local_138 = uVar8 * 8 + 0x20;
      for (lVar10 = 0; uVar5 != (uint)lVar10; lVar10 = lVar10 + 1) {
        v.data[uVar13] = in[lVar10 + uVar8 + 4];
        uVar13 = uVar13 + 1;
        local_138 = local_138 + 8;
      }
      uVar5 = 0;
    }
    else {
      if (bVar11 == 3) {
        uVar5 = 0x14;
        break;
      }
      tree_ll.tree2d = (uint *)0x0;
      tree_ll.tree1d = (uint *)0x0;
      tree_ll.lengths = (uint *)0x0;
      local_78.tree2d = (uint *)0x0;
      local_78.tree1d = (uint *)0x0;
      local_78.lengths = (uint *)0x0;
      if (bVar11 == 2) {
        uVar8 = local_138 + 0x11;
        uVar5 = 0x31;
        local_138 = uVar14;
        if (uVar8 <= local_110) {
          uVar5 = readBitsFromStream(&local_138,local_118,5);
          local_100 = CONCAT44(extraout_var,uVar5);
          uVar5 = readBitsFromStream(&local_138,puVar2,5);
          local_108 = CONCAT44(extraout_var_00,uVar5);
          uVar4 = readBitsFromStream(&local_138,puVar2,4);
          uVar5 = 0x32;
          if ((uVar4 + 4) * 3 + local_138 <= local_110) {
            local_58.tree2d = (uint *)0x0;
            local_58.tree1d = (uint *)0x0;
            local_58.lengths = (uint *)0x0;
            bitlen = (uint *)malloc(0x4c);
            if (bitlen == (uint *)0x0) {
              uVar5 = 0x53;
              puVar9 = (uint *)0x0;
              puVar15 = (uint *)0x0;
            }
            else {
              local_f4 = (int)local_100 + 0x101;
              local_108 = (ulong)((int)local_108 + 1);
              puVar15 = CLCL_ORDER;
              for (uVar8 = 0; uVar8 != 0x13; uVar8 = uVar8 + 1) {
                uVar5 = 0;
                if (uVar8 < uVar4 + 4) {
                  uVar5 = readBitsFromStream(&local_138,local_118,3);
                }
                bitlen[*puVar15] = uVar5;
                puVar15 = puVar15 + 1;
              }
              uVar5 = HuffmanTree_makeFromLengths(&local_58,bitlen,0x13,7);
              if (uVar5 == 0) {
                puVar9 = (uint *)malloc(0x480);
                puVar15 = (uint *)malloc(0x80);
                if (puVar15 == (uint *)0x0 || puVar9 == (uint *)0x0) {
                  uVar5 = 0x53;
                }
                else {
                  for (lVar10 = 0; lVar10 != 0x120; lVar10 = lVar10 + 1) {
                    puVar9[lVar10] = 0;
                  }
                  for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
                    puVar15[lVar10] = 0;
                  }
                  local_108 = (ulong)((int)local_108 + local_f4);
                  iVar1 = (int)local_100;
                  local_e4 = iVar1 + 0x102;
                  local_f0 = (ulong)local_f4;
                  local_100 = (ulong)(-iVar1 - 0x101);
                  uVar8 = 0;
                  uVar5 = 0;
                  local_128 = puVar15;
                  local_120 = puVar9;
LAB_001aae53:
                  uVar8 = uVar8 & 0xffffffff;
                  puVar12 = local_120 + uVar8;
                  while( true ) {
                    uVar4 = (uint)uVar8;
                    if ((uint)local_108 <= uVar4) {
                      puVar9 = local_120;
                      puVar15 = local_128;
                      if (uVar5 == 0) {
                        if (local_120[0x100] == 0) {
                          uVar5 = 0x40;
                        }
                        else {
                          uVar5 = HuffmanTree_makeFromLengths(&tree_ll,local_120,0x120,0xf);
                          puVar15 = local_128;
                          puVar9 = local_120;
                          if (uVar5 == 0) {
                            uVar5 = HuffmanTree_makeFromLengths(&local_78,local_128,0x20,0xf);
                            puVar9 = local_120;
                          }
                        }
                      }
                      goto LAB_001ab036;
                    }
                    uVar6 = huffmanDecodeSymbol(local_118,&local_138,&local_58,local_110);
                    if (0xf < uVar6) break;
                    puVar15 = local_128;
                    uVar7 = local_f4;
                    if (uVar4 < local_f4) {
                      uVar7 = 0;
                      puVar15 = local_120;
                    }
                    puVar15[uVar4 - uVar7] = uVar6;
                    uVar8 = uVar8 + 1;
                    puVar12 = puVar12 + 1;
                  }
                  puVar15 = local_128;
                  puVar9 = local_120;
                  if (uVar6 != 0x10) {
                    if (uVar6 == 0x11) {
                      if (local_110 < local_138 + 3) goto LAB_001ab2a7;
                      uVar4 = readBitsFromStream(&local_138,local_118,3);
                      iVar3 = uVar4 + 3;
                      while (bVar16 = iVar3 != 0, iVar3 = iVar3 + -1, bVar16) {
                        if (local_108 == uVar8) {
                          uVar5 = 0xe;
                          break;
                        }
                        puVar15 = local_128 + (uint)((int)local_100 + (int)uVar8);
                        if (uVar8 < local_f0) {
                          puVar15 = puVar12;
                        }
                        *puVar15 = 0;
                        uVar8 = uVar8 + 1;
                        puVar12 = puVar12 + 1;
                      }
                    }
                    else {
                      if (uVar6 != 0x12) {
                        if (uVar6 == 0xffffffff) {
                          uVar5 = 0xb - (local_110 < local_138);
                        }
                        else {
                          uVar5 = 0x10;
                        }
                        goto LAB_001ab036;
                      }
                      if (local_110 < local_138 + 7) goto LAB_001ab2a7;
                      uVar4 = readBitsFromStream(&local_138,local_118,7);
                      iVar3 = uVar4 + 0xb;
                      while (bVar16 = iVar3 != 0, iVar3 = iVar3 + -1, bVar16) {
                        if (local_108 == uVar8) {
                          uVar5 = 0xf;
                          break;
                        }
                        puVar15 = local_128 + (uint)((int)local_100 + (int)uVar8);
                        if (uVar8 < local_f0) {
                          puVar15 = puVar12;
                        }
                        *puVar15 = 0;
                        uVar8 = uVar8 + 1;
                        puVar12 = puVar12 + 1;
                      }
                    }
                    goto LAB_001aae53;
                  }
                  if (uVar4 == 0) {
                    uVar5 = 0x36;
                    goto LAB_001ab036;
                  }
                  if (local_138 + 2 <= local_110) {
                    uVar6 = readBitsFromStream(&local_138,local_118,2);
                    iVar3 = uVar6 + 3;
                    puVar15 = local_128 + ((-0x102 - iVar1) + uVar4);
                    if (uVar4 < local_e4) {
                      puVar15 = local_120 + (uVar4 - 1);
                    }
                    uVar4 = *puVar15;
                    while (bVar16 = iVar3 != 0, iVar3 = iVar3 + -1, bVar16) {
                      if (local_108 == uVar8) {
                        uVar5 = 0xd;
                        break;
                      }
                      puVar15 = local_128 + (uint)((int)local_100 + (int)uVar8);
                      if (uVar8 < local_f0) {
                        puVar15 = puVar12;
                      }
                      *puVar15 = uVar4;
                      uVar8 = uVar8 + 1;
                      puVar12 = puVar12 + 1;
                    }
                    goto LAB_001aae53;
                  }
LAB_001ab2a7:
                  uVar5 = 0x32;
                }
              }
              else {
                puVar9 = (uint *)0x0;
                puVar15 = (uint *)0x0;
              }
            }
LAB_001ab036:
            free(bitlen);
            free(puVar9);
            free(puVar15);
            HuffmanTree_cleanup(&local_58);
          }
        }
      }
      else {
        uVar5 = 0;
        local_138 = uVar14;
        if (bVar11 == 1) {
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&local_78);
        }
      }
      while (uVar8 = local_110, uVar5 == 0) {
        uVar4 = huffmanDecodeSymbol(local_118,&local_138,&tree_ll,local_110);
        puVar2 = local_118;
        if (uVar4 < 0x100) {
          uVar5 = ucvector_resize(&v,uVar13 + 1);
          if (uVar5 == 0) {
            uVar5 = 0x53;
            break;
          }
          v.data[uVar13] = (uchar)uVar4;
          uVar5 = 0;
          uVar13 = uVar13 + 1;
        }
        else {
          if ((uVar4 == 0x100) || (0x11d < uVar4)) {
            uVar5 = 0;
            if (uVar4 != 0x100) {
              uVar5 = 0xb - (local_110 < local_138);
            }
            break;
          }
          if (uVar8 < local_138 + LENGTHEXTRA[uVar4 - 0x101]) {
            uVar5 = 0x33;
            break;
          }
          uVar5 = LENGTHBASE[uVar4 - 0x101];
          uVar4 = readBitsFromStream(&local_138,local_118,(ulong)LENGTHEXTRA[uVar4 - 0x101]);
          uVar6 = huffmanDecodeSymbol(puVar2,&local_138,&local_78,uVar8);
          if (0x1d < uVar6) {
            uVar5 = 0x12;
            break;
          }
          if (uVar8 < local_138 + DISTANCEEXTRA[uVar6]) {
            uVar5 = 0x33;
            break;
          }
          uVar7 = readBitsFromStream(&local_138,local_118,(ulong)DISTANCEEXTRA[uVar6]);
          uVar8 = (ulong)(uVar7 + DISTANCEBASE[uVar6]);
          if (uVar13 < uVar8) {
            uVar5 = 0x34;
            break;
          }
          uVar14 = (ulong)uVar4 + (ulong)uVar5;
          uVar5 = ucvector_resize(&v,uVar14 + uVar13);
          if (uVar5 == 0) {
            uVar5 = 0x53;
            break;
          }
          if (uVar8 < uVar14) {
            while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
              v.data[uVar13] = v.data[uVar13 - uVar8];
              uVar13 = uVar13 + 1;
            }
            uVar5 = 0;
          }
          else {
            memcpy(v.data + uVar13,v.data + (uVar13 - uVar8),uVar14);
            uVar5 = 0;
            uVar13 = uVar14 + uVar13;
          }
        }
      }
      HuffmanTree_cleanup(&tree_ll);
      HuffmanTree_cleanup(&local_78);
    }
  } while (uVar5 == 0);
  *out = v.data;
  *outsize = v.size;
  return uVar5;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}